

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxReporters.cpp
# Opt level: O0

void __thiscall
ApprovalTests::Linux::SublimeMergeReporter::SublimeMergeReporter(SublimeMergeReporter *this)

{
  initializer_list<ApprovalTests::Reporter_*> __l;
  FirstWorkingReporter *pFVar1;
  allocator_type *__a;
  pointer ppRVar2;
  vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *in_RDI;
  vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *this_00;
  size_type in_stack_ffffffffffffffa0;
  vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>
  *in_stack_ffffffffffffffa8;
  FirstWorkingReporter *this_01;
  SublimeMergeDirectDownloadReporter *in_stack_ffffffffffffffc0;
  
  pFVar1 = (FirstWorkingReporter *)operator_new(0x70);
  SublimeMergeSnapReporter::SublimeMergeSnapReporter
            ((SublimeMergeSnapReporter *)in_stack_ffffffffffffffc0);
  this_01 = pFVar1;
  __a = (allocator_type *)operator_new(0x70);
  SublimeMergeFlatpakReporter::SublimeMergeFlatpakReporter
            ((SublimeMergeFlatpakReporter *)in_stack_ffffffffffffffc0);
  this_00 = (vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_> *)
            &stack0xffffffffffffffc0;
  ppRVar2 = (pointer)operator_new(0x70);
  SublimeMergeRepositoryPackageReporter::SublimeMergeRepositoryPackageReporter
            ((SublimeMergeRepositoryPackageReporter *)in_stack_ffffffffffffffc0);
  (this_00->
  super__Vector_base<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>)._M_impl
  .super__Vector_impl_data._M_start = ppRVar2;
  operator_new(0x70);
  SublimeMergeDirectDownloadReporter::SublimeMergeDirectDownloadReporter(in_stack_ffffffffffffffc0);
  ::std::allocator<ApprovalTests::Reporter_*>::allocator
            ((allocator<ApprovalTests::Reporter_*> *)0x169c1f);
  __l._M_len = in_stack_ffffffffffffffa0;
  __l._M_array = (iterator)pFVar1;
  ::std::vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>::vector
            (in_RDI,__l,__a);
  FirstWorkingReporter::FirstWorkingReporter(this_01,in_stack_ffffffffffffffa8);
  ::std::vector<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>::~vector
            (this_00);
  ::std::allocator<ApprovalTests::Reporter_*>::~allocator
            ((allocator<ApprovalTests::Reporter_*> *)0x169c6a);
  (in_RDI->super__Vector_base<ApprovalTests::Reporter_*,_std::allocator<ApprovalTests::Reporter_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__SublimeMergeReporter_002296b0;
  return;
}

Assistant:

SublimeMergeReporter::SublimeMergeReporter()
            : FirstWorkingReporter({new SublimeMergeSnapReporter(),
                                    new SublimeMergeFlatpakReporter(),
                                    new SublimeMergeRepositoryPackageReporter(),
                                    new SublimeMergeDirectDownloadReporter()})
        {
        }